

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

bool __thiscall LTFlightData::TryGetSafeCopy(LTFlightData *this,FDStaticData *outStat)

{
  int iVar1;
  bool bVar2;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_30;
  
  local_30._M_device = &this->dataAccessMutex;
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)local_30._M_device);
  bVar2 = iVar1 == 0;
  local_30._M_owns = bVar2;
  if (bVar2) {
    FDStaticData::operator=(outStat,&this->statData);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  return bVar2;
}

Assistant:

bool LTFlightData::TryGetSafeCopy ( LTFlightData::FDStaticData& outStat ) const
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( lock )
        {
            // we got the lock, return a copy of the data
            outStat = statData;
            // Success!
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}